

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O0

TestResult * iuutil::GetTestSuiteAdHocResult(TestSuite *test_suite)

{
  TestResult *pTVar1;
  TestSuite *test_suite_local;
  
  pTVar1 = iutest::TestSuite::ad_hoc_test_result(test_suite);
  pTVar1 = TestResultPointer(pTVar1);
  return pTVar1;
}

Assistant:

inline const ::iutest::TestResult* GetTestSuiteAdHocResult(const ::iutest::TestSuite* test_suite)
{
#if !defined(IUTEST_NO_TESTCASE_AD_HOC_TEST_RESULT_ACCESSOR)
    return TestResultPointer(test_suite->ad_hoc_test_result());
#else
    IUTEST_UNUSED_VAR(test_suite);
    return GetAdHocTestResult();
#endif
}